

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

uint32_t nni_msg_trim_u32(nni_msg *m)

{
  uint32_t uVar1;
  nni_msg *m_local;
  
  uVar1 = nni_chunk_trim_u32(&m->m_body);
  return uVar1;
}

Assistant:

uint32_t
nni_msg_trim_u32(nni_msg *m)
{
	return (nni_chunk_trim_u32(&m->m_body));
}